

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentialExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::ExponentialExpression::derivative
          (ExponentialExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  BaseExpressionPtr BVar2;
  Expression *in_stack_ffffffffffffff78;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_ffffffffffffffa8;
  
  exp<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>(in_stack_ffffffffffffffa8);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12ddf8);
  (*peVar1->_vptr_BaseExpression[1])(&stack0xffffffffffffffa8,peVar1,in_RDX);
  operator*<Kandinsky::ExponentialExpression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (this,(shared_ptr<Kandinsky::BaseExpression> *)variable);
  BaseExpression::makePtr<Kandinsky::Expression>(in_stack_ffffffffffffff78);
  Expression::~Expression((Expression *)0x12de41);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12de4b);
  ~ExponentialExpression((ExponentialExpression *)0x12de55);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr ExponentialExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(exp(m_arg) * m_arg->derivative(variable));
    }